

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall Catch::AssertionResult::~AssertionResult(AssertionResult *this)

{
  AssertionResult *this_local;
  
  AssertionResultData::~AssertionResultData(&this->m_resultData);
  return;
}

Assistant:

AssertionResult() = delete;